

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O0

bool loadTerrainProgram(GLuint *glp,char *flag,GLuint uniformOffset)

{
  bool bVar1;
  int iVar2;
  GLint GVar3;
  GLenum GVar4;
  djg_program *program;
  char *pcVar5;
  uint local_48c;
  int vertexCnt_1;
  int vertexCnt;
  int subdLevel;
  char buf [1024];
  djg_program *djp;
  GLuint uniformOffset_local;
  char *flag_local;
  GLuint *glp_local;
  
  program = djgp_create();
  fprintf(_stdout,"Loading {Terrain-Program}\n");
  fflush(_stdout);
  if ((g_terrain.flags.freeze & 1U) == 0) {
    djgp_push_string(program,flag);
  }
  if (g_terrain.method == 3) {
    djgp_push_string(program,
                     "#ifndef FRAGMENT_SHADER\n#extension GL_NV_mesh_shader : require\n#endif\n");
    djgp_push_string(program,"#extension GL_NV_shader_thread_group : require\n");
    djgp_push_string(program,"#extension GL_NV_shader_thread_shuffle : require\n");
    djgp_push_string(program,"#extension GL_NV_gpu_shader5 : require\n");
  }
  if (g_camera.projection == 0) {
    djgp_push_string(program,"#define PROJECTION_ORTHOGRAPHIC\n");
  }
  else if (g_camera.projection == 1) {
    djgp_push_string(program,"#define PROJECTION_RECTILINEAR\n");
  }
  else if (g_camera.projection == 2) {
    djgp_push_string(program,"#define PROJECTION_FISHEYE\n");
  }
  djgp_push_string(program,"#define BUFFER_BINDING_TERRAIN_VARIABLES %i\n",0);
  djgp_push_string(program,"#define BUFFER_BINDING_MESHLET_VERTICES %i\n",3);
  djgp_push_string(program,"#define BUFFER_BINDING_MESHLET_INDEXES %i\n",4);
  djgp_push_string(program,"#define TERRAIN_PATCH_SUBD_LEVEL %i\n",(ulong)(uint)g_terrain.gpuSubd);
  djgp_push_string(program,"#define TERRAIN_PATCH_TESS_FACTOR %i\n",
                   (ulong)(uint)(1 << ((byte)g_terrain.gpuSubd & 0x1f)));
  djgp_push_string(program,"#define LEB_BUFFER_COUNT 1\n");
  djgp_push_string(program,"#define BUFFER_BINDING_LEB %i\n",0);
  if (g_terrain.shading == 1) {
    djgp_push_string(program,"#define SHADING_DIFFUSE 1\n");
  }
  else if (g_terrain.shading == 2) {
    djgp_push_string(program,"#define SHADING_NORMALS 1\n");
  }
  else if (g_terrain.shading == 0) {
    djgp_push_string(program,"#define SHADING_SNOWY 1\n");
  }
  else if (g_terrain.shading == 3) {
    djgp_push_string(program,"#define SHADING_COLOR 1\n");
  }
  if ((g_terrain.flags.displace & 1U) != 0) {
    djgp_push_string(program,"#define FLAG_DISPLACE 1\n");
  }
  if ((g_terrain.flags.cull & 1U) != 0) {
    djgp_push_string(program,"#define FLAG_CULL 1\n");
  }
  if ((g_terrain.flags.wire & 1U) != 0) {
    djgp_push_string(program,"#define FLAG_WIRE 1\n");
  }
  pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"FrustumCulling.glsl");
  djgp_push_file(program,pcVar5);
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderCommon.glsl");
  djgp_push_file(program,pcVar5);
  if (g_terrain.method == 0) {
    djgp_push_string(program,"#define BUFFER_BINDING_LEB_NODE_COUNTER %i\n",6);
    djgp_push_string(program,"#define BUFFER_BINDING_LEB_NODE_BUFFER %i\n",5);
    iVar2 = strcmp("/* thisIsAHackForComputePass */\n",flag);
    if (iVar2 == 0) {
      if ((g_terrain.flags.wire & 1U) == 0) {
        pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderCS.glsl");
        djgp_push_file(program,pcVar5);
      }
      else {
        pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderCS_Wire.glsl");
        djgp_push_file(program,pcVar5);
      }
    }
    else {
      pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainUpdateCS.glsl");
      djgp_push_file(program,pcVar5);
    }
  }
  else if (g_terrain.method == 1) {
    if ((g_terrain.flags.wire & 1U) == 0) {
      pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderTS.glsl");
      djgp_push_file(program,pcVar5);
    }
    else {
      pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderTS_Wire.glsl");
      djgp_push_file(program,pcVar5);
    }
  }
  else if (g_terrain.method == 2) {
    if ((g_terrain.flags.wire & 1U) == 0) {
      if (g_terrain.gpuSubd == 0) {
        local_48c = 3;
      }
      else {
        local_48c = 4 << ((char)(g_terrain.gpuSubd << 1) - 1U & 0x1f);
      }
      djgp_push_string(program,"#define MAX_VERTICES %i\n",(ulong)local_48c);
      pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderGS.glsl");
      djgp_push_file(program,pcVar5);
    }
    else {
      djgp_push_string(program,"#define MAX_VERTICES %i\n",
                       (ulong)(uint)(3 << ((byte)(g_terrain.gpuSubd << 1) & 0x1f)));
      pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderGS_Wire.glsl");
      djgp_push_file(program,pcVar5);
    }
  }
  else if (g_terrain.method == 3) {
    pcVar5 = strcat2((char *)&vertexCnt,g_app.dir.shader,"TerrainRenderMS.glsl");
    djgp_push_file(program,pcVar5);
  }
  bVar1 = djgp_to_gl(program,0x1c2,false,true,glp);
  if (bVar1) {
    djgp_release(program);
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_DmapFactor");
    g_gl.uniforms[uniformOffset + 4] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_LodFactor");
    g_gl.uniforms[uniformOffset + 6] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_DmapSampler");
    g_gl.uniforms[uniformOffset + 2] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_SmapSampler");
    g_gl.uniforms[uniformOffset + 3] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_TargetEdgeLength");
    g_gl.uniforms[uniformOffset + 5] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_MinLodVariance");
    g_gl.uniforms[uniformOffset + 7] = GVar3;
    GVar3 = (*glad_glGetUniformLocation)(*glp,"u_ScreenResolution");
    g_gl.uniforms[uniformOffset + 8] = GVar3;
    configureTerrainProgram(*glp,uniformOffset);
    GVar4 = (*glad_glGetError)();
    glp_local._7_1_ = GVar4 == 0;
  }
  else {
    djgp_release(program);
    glp_local._7_1_ = false;
  }
  return glp_local._7_1_;
}

Assistant:

bool loadTerrainProgram(GLuint *glp, const char *flag, GLuint uniformOffset)
{
    djg_program *djp = djgp_create();
    char buf[1024];

    LOG("Loading {Terrain-Program}\n");
    if (!g_terrain.flags.freeze)
        djgp_push_string(djp, flag);
    if (g_terrain.method == METHOD_MS) {
        djgp_push_string(djp, "#ifndef FRAGMENT_SHADER\n#extension GL_NV_mesh_shader : require\n#endif\n");
        djgp_push_string(djp, "#extension GL_NV_shader_thread_group : require\n");
        djgp_push_string(djp, "#extension GL_NV_shader_thread_shuffle : require\n");
        djgp_push_string(djp, "#extension GL_NV_gpu_shader5 : require\n");
    }
    switch (g_camera.projection) {
    case PROJECTION_RECTILINEAR:
        djgp_push_string(djp, "#define PROJECTION_RECTILINEAR\n");
        break;
    case PROJECTION_FISHEYE:
        djgp_push_string(djp, "#define PROJECTION_FISHEYE\n");
        break;
    case PROJECTION_ORTHOGRAPHIC:
        djgp_push_string(djp, "#define PROJECTION_ORTHOGRAPHIC\n");
        break;
    default:
        break;
    }
    djgp_push_string(djp, "#define BUFFER_BINDING_TERRAIN_VARIABLES %i\n", STREAM_TERRAIN_VARIABLES);
    djgp_push_string(djp, "#define BUFFER_BINDING_MESHLET_VERTICES %i\n", BUFFER_MESHLET_VERTICES);
    djgp_push_string(djp, "#define BUFFER_BINDING_MESHLET_INDEXES %i\n", BUFFER_MESHLET_INDEXES);
    djgp_push_string(djp, "#define TERRAIN_PATCH_SUBD_LEVEL %i\n", g_terrain.gpuSubd);
    djgp_push_string(djp, "#define TERRAIN_PATCH_TESS_FACTOR %i\n", 1 << g_terrain.gpuSubd);
    djgp_push_string(djp, "#define LEB_BUFFER_COUNT 1\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_LEB %i\n", BUFFER_LEB);
    if (g_terrain.shading == SHADING_DIFFUSE)
        djgp_push_string(djp, "#define SHADING_DIFFUSE 1\n");
    else if (g_terrain.shading == SHADING_NORMALS)
        djgp_push_string(djp, "#define SHADING_NORMALS 1\n");
    else if (g_terrain.shading == SHADING_SNOWY)
        djgp_push_string(djp, "#define SHADING_SNOWY 1\n");
    else if (g_terrain.shading == SHADING_COLOR)
        djgp_push_string(djp, "#define SHADING_COLOR 1\n");
    if (g_terrain.flags.displace)
        djgp_push_string(djp, "#define FLAG_DISPLACE 1\n");
    if (g_terrain.flags.cull)
        djgp_push_string(djp, "#define FLAG_CULL 1\n");
    if (g_terrain.flags.wire)
        djgp_push_string(djp, "#define FLAG_WIRE 1\n");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "FrustumCulling.glsl"));
    djgp_push_file(djp, PATH_TO_LEB_GLSL_LIBRARY "LongestEdgeBisection.glsl");
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCommon.glsl"));
    if (g_terrain.method == METHOD_CS) {
        djgp_push_string(djp, "#define BUFFER_BINDING_LEB_NODE_COUNTER %i\n", BUFFER_LEB_NODE_COUNTER);
        djgp_push_string(djp, "#define BUFFER_BINDING_LEB_NODE_BUFFER %i\n", BUFFER_LEB_NODE_BUFFER);

        if (strcmp("/* thisIsAHackForComputePass */\n", flag) == 0) {
            if (g_terrain.flags.wire) {
                djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCS_Wire.glsl"));
            } else {
                djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderCS.glsl"));
            }
        } else {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainUpdateCS.glsl"));
        }
    } else if (g_terrain.method == METHOD_TS) {
        if (g_terrain.flags.wire) {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderTS_Wire.glsl"));
        } else {
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderTS.glsl"));
        }
    } else if (g_terrain.method == METHOD_GS) {
        int subdLevel = g_terrain.gpuSubd;

        if (g_terrain.flags.wire) {
            int vertexCnt = 3 << (2 * subdLevel);

            djgp_push_string(djp, "#define MAX_VERTICES %i\n", vertexCnt);
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderGS_Wire.glsl"));
        } else {
            int vertexCnt = subdLevel == 0 ? 3 : 4 << (2 * subdLevel - 1);

            djgp_push_string(djp, "#define MAX_VERTICES %i\n", vertexCnt);
            djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderGS.glsl"));
        }
    } else if (g_terrain.method == METHOD_MS) {
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "TerrainRenderMS.glsl"));
    }

    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_TERRAIN_DMAP_FACTOR + uniformOffset] =
        glGetUniformLocation(*glp, "u_DmapFactor");
    g_gl.uniforms[UNIFORM_TERRAIN_LOD_FACTOR + uniformOffset] =
        glGetUniformLocation(*glp, "u_LodFactor");
    g_gl.uniforms[UNIFORM_TERRAIN_DMAP_SAMPLER + uniformOffset] =
        glGetUniformLocation(*glp, "u_DmapSampler");
    g_gl.uniforms[UNIFORM_TERRAIN_SMAP_SAMPLER + uniformOffset] =
        glGetUniformLocation(*glp, "u_SmapSampler");
    g_gl.uniforms[UNIFORM_TERRAIN_TARGET_EDGE_LENGTH + uniformOffset] =
        glGetUniformLocation(*glp, "u_TargetEdgeLength");
    g_gl.uniforms[UNIFORM_TERRAIN_MIN_LOD_VARIANCE + uniformOffset] =
        glGetUniformLocation(*glp, "u_MinLodVariance");
    g_gl.uniforms[UNIFORM_TERRAIN_SCREEN_RESOLUTION + uniformOffset] =
        glGetUniformLocation(*glp, "u_ScreenResolution");

    configureTerrainProgram(*glp, uniformOffset);

    return (glGetError() == GL_NO_ERROR);
}